

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_input_has_mouse_click_down_in_rect(nk_input *i,nk_buttons id,nk_rect b,int down)

{
  int iVar1;
  bool local_39;
  nk_mouse_button *btn;
  int down_local;
  nk_buttons id_local;
  nk_input *i_local;
  nk_rect b_local;
  
  if (i == (nk_input *)0x0) {
    b_local.w = 0.0;
  }
  else {
    iVar1 = nk_input_has_mouse_click_in_rect(i,id,b);
    local_39 = false;
    if (iVar1 != 0) {
      local_39 = (i->mouse).buttons[id].down == down;
    }
    b_local.w = (float)(uint)local_39;
  }
  return (int)b_local.w;
}

Assistant:

NK_API int
nk_input_has_mouse_click_down_in_rect(const struct nk_input *i, enum nk_buttons id,
    struct nk_rect b, int down)
{
    const struct nk_mouse_button *btn;
    if (!i) return nk_false;
    btn = &i->mouse.buttons[id];
    return nk_input_has_mouse_click_in_rect(i, id, b) && (btn->down == down);
}